

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

char * get_server_rep_FMformat(FMFormat_conflict format,int *rep_length)

{
  format_rep p_Var1;
  ushort uVar2;
  
  if (format->server_format_rep == (format_rep)0x0) {
    p_Var1 = build_server_format_rep(format);
    format->server_format_rep = p_Var1;
  }
  p_Var1 = format->server_format_rep;
  uVar2 = p_Var1->format_rep_length << 8 | p_Var1->format_rep_length >> 8;
  *rep_length = (uint)uVar2;
  if (p_Var1->server_rep_version != '\0') {
    *rep_length = CONCAT22(p_Var1->top_bytes_format_rep_length << 8 |
                           p_Var1->top_bytes_format_rep_length >> 8,uVar2);
  }
  return (char *)p_Var1;
}

Assistant:

extern char *
get_server_rep_FMformat(FMFormat format, int *rep_length)
{
    if (format->server_format_rep == NULL) {
	format->server_format_rep = 
	    build_server_format_rep(format);
    }
    *rep_length = ntohs(format->server_format_rep->format_rep_length);
    if (format->server_format_rep->server_rep_version > 0) {
	*rep_length += (ntohs(format->server_format_rep->top_bytes_format_rep_length) << 16);
    }
    return (char*)format->server_format_rep;
}